

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleARGBFilterCols64_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x32,int dx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint32_t b_1;
  uint32_t a_1;
  int xf_1;
  int64_t xi_1;
  uint32_t b;
  uint32_t a;
  int xf;
  int64_t xi;
  int j;
  uint32_t *dst;
  uint32_t *src;
  int64_t x;
  int dx_local;
  int x32_local;
  int dst_width_local;
  uint8_t *src_argb_local;
  uint8_t *dst_argb_local;
  
  x = (int64_t)x32;
  dst = (uint32_t *)dst_argb;
  for (j = 0; lVar4 = x >> 0x10, uVar2 = (uint)(x >> 9), j < dst_width + -1; j = j + 2) {
    uVar2 = uVar2 & 0x7f;
    uVar1 = *(uint *)(src_argb + lVar4 * 4);
    uVar3 = *(uint *)(src_argb + lVar4 * 4 + 4);
    *dst = ((uVar1 >> 0x18) * (uVar2 ^ 0x7f) + (uVar3 >> 0x18) * uVar2 >> 7) << 0x18 |
           ((uVar1 >> 0x10 & 0xff) * (uVar2 ^ 0x7f) + (uVar3 >> 0x10 & 0xff) * uVar2 >> 7) << 0x10 |
           ((uVar1 >> 8 & 0xff) * (uVar2 ^ 0x7f) + (uVar3 >> 8 & 0xff) * uVar2 >> 7) << 8 |
           (uVar1 & 0xff) * (uVar2 ^ 0x7f) + (uVar3 & 0xff) * uVar2 >> 7;
    lVar4 = dx + x;
    uVar3 = (uint)(lVar4 >> 9) & 0x7f;
    uVar2 = *(uint *)(src_argb + (lVar4 >> 0x10) * 4);
    uVar1 = *(uint *)(src_argb + (lVar4 >> 0x10) * 4 + 4);
    dst[1] = ((uVar2 >> 0x18) * (uVar3 ^ 0x7f) + (uVar1 >> 0x18) * uVar3 >> 7) << 0x18 |
             ((uVar2 >> 0x10 & 0xff) * (uVar3 ^ 0x7f) + (uVar1 >> 0x10 & 0xff) * uVar3 >> 7) << 0x10
             | ((uVar2 >> 8 & 0xff) * (uVar3 ^ 0x7f) + (uVar1 >> 8 & 0xff) * uVar3 >> 7) << 8 |
             (uVar2 & 0xff) * (uVar3 ^ 0x7f) + (uVar1 & 0xff) * uVar3 >> 7;
    x = dx + lVar4;
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    uVar2 = uVar2 & 0x7f;
    uVar1 = *(uint *)(src_argb + lVar4 * 4);
    uVar3 = *(uint *)(src_argb + lVar4 * 4 + 4);
    *dst = ((uVar1 >> 0x18) * (uVar2 ^ 0x7f) + (uVar3 >> 0x18) * uVar2 >> 7) << 0x18 |
           ((uVar1 >> 0x10 & 0xff) * (uVar2 ^ 0x7f) + (uVar3 >> 0x10 & 0xff) * uVar2 >> 7) << 0x10 |
           ((uVar1 >> 8 & 0xff) * (uVar2 ^ 0x7f) + (uVar3 >> 8 & 0xff) * uVar2 >> 7) << 8 |
           (uVar1 & 0xff) * (uVar2 ^ 0x7f) + (uVar3 & 0xff) * uVar2 >> 7;
  }
  return;
}

Assistant:

void ScaleARGBFilterCols64_C(uint8_t* dst_argb,
                             const uint8_t* src_argb,
                             int dst_width,
                             int x32,
                             int dx) {
  int64_t x = (int64_t)(x32);
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
    x += dx;
    xi = x >> 16;
    xf = (x >> 9) & 0x7f;
    a = src[xi];
    b = src[xi + 1];
    dst[1] = BLENDER(a, b, xf);
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
  }
}